

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

void __thiscall DPlayerMenu::Init(DPlayerMenu *this,DMenu *parent,FListMenuDescriptor *desc)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  AActor *pAVar4;
  PSymbolTable *pPVar5;
  char *pcVar6;
  FTeam *this_00;
  PClass *pPVar7;
  bool bVar8;
  float fVar9;
  int local_12c;
  uint local_11c;
  int local_dc;
  FName local_94;
  FName local_90;
  FName local_8c;
  FName local_88;
  int local_84;
  undefined1 local_80 [4];
  int pclass;
  PClass *local_78;
  char *cls;
  uint i_1;
  undefined1 local_60 [16];
  FName local_50;
  FName local_4c;
  FName local_48;
  uint32 local_44;
  uint32 local_40;
  int color;
  int mycolorset;
  uint i;
  TFlags<ActorFlag4,_unsigned_int> local_30;
  FName local_2c;
  PSymbolTable *local_28;
  FListMenuItem *li;
  FListMenuDescriptor *desc_local;
  DMenu *parent_local;
  DPlayerMenu *this_local;
  
  li = (FListMenuItem *)desc;
  desc_local = (FListMenuDescriptor *)parent;
  parent_local = (DMenu *)this;
  DListMenu::Init(&this->super_DListMenu,parent,desc);
  PickPlayerClass(this);
  this->mRotation = 0;
  FName::FName(&local_2c,NAME_Playerdisplay);
  local_28 = (PSymbolTable *)DListMenu::GetItem(&this->super_DListMenu,&local_2c);
  if (local_28 != (PSymbolTable *)0x0) {
    (*(code *)local_28->ParentSymbolTable[2].Symbols.LastFree)(local_28,0x10001,0);
    (*(code *)local_28->ParentSymbolTable[2].Symbols.LastFree)(local_28,0x10004,1);
    (*(code *)local_28->ParentSymbolTable[2].Symbols.LastFree)(local_28,0x10005,1);
    pPVar5 = local_28;
    iVar1 = userinfo_t::GetPlayerClassNum((userinfo_t *)((long)consoleplayer * 0x2a0 + 0x1ae70f8));
    (*(code *)pPVar5->ParentSymbolTable[2].Symbols.LastFree)(pPVar5,0x10003,iVar1);
    bVar8 = false;
    if (this->PlayerClass != (FPlayerClass *)0x0) {
      pAVar4 = GetDefaultByType((PClass *)this->PlayerClass->Type);
      TFlags<ActorFlag4,_unsigned_int>::operator&
                (&local_30,
                 (int)pAVar4 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH)
                );
      uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_30);
      bVar8 = false;
      if (uVar2 == 0) {
        iVar1 = userinfo_t::GetPlayerClassNum
                          ((userinfo_t *)((long)consoleplayer * 0x2a0 + 0x1ae70f8));
        bVar8 = iVar1 != -1;
      }
    }
    pPVar5 = local_28;
    if (bVar8) {
      iVar1 = userinfo_t::GetSkin((userinfo_t *)((long)consoleplayer * 0x2a0 + 0x1ae70f8));
      (*(code *)pPVar5->ParentSymbolTable[2].Symbols.LastFree)(pPVar5,0x10002,iVar1);
    }
  }
  FName::FName((FName *)&i,NAME_Playerbox);
  pPVar5 = (PSymbolTable *)DListMenu::GetItem(&this->super_DListMenu,(FName *)&i);
  local_28 = pPVar5;
  if (pPVar5 != (PSymbolTable *)0x0) {
    pcVar6 = FStringCVar::operator_cast_to_char_(&::name);
    (*(code *)pPVar5->ParentSymbolTable[2].ParentSymbolTable)(pPVar5,0,pcVar6);
  }
  FName::FName((FName *)&mycolorset,NAME_Team);
  local_28 = (PSymbolTable *)DListMenu::GetItem(&this->super_DListMenu,(FName *)&mycolorset);
  if (local_28 != (PSymbolTable *)0x0) {
    (*(code *)local_28->ParentSymbolTable[2].ParentSymbolTable)(local_28,0,"None");
    for (color = 0; iVar1 = color, uVar2 = TArray<FTeam,_FTeam>::Size(&Teams), pPVar5 = local_28,
        (uint)iVar1 < uVar2; color = color + 1) {
      uVar2 = color + 1;
      this_00 = TArray<FTeam,_FTeam>::operator[](&Teams,(ulong)(uint)color);
      pcVar6 = FTeam::GetName(this_00);
      (*(code *)pPVar5->ParentSymbolTable[2].ParentSymbolTable)(pPVar5,(ulong)uVar2,pcVar6);
    }
    iVar1 = FIntCVar::operator_cast_to_int(&team);
    if (iVar1 == 0xff) {
      local_dc = 0;
    }
    else {
      local_dc = FIntCVar::operator_cast_to_int(&team);
      local_dc = local_dc + 1;
    }
    (*(code *)pPVar5->ParentSymbolTable[2].Symbols.LastFree)(pPVar5,0,local_dc);
  }
  local_40 = userinfo_t::GetColorSet((userinfo_t *)((long)consoleplayer * 0x2a0 + 0x1ae70f8));
  local_44 = userinfo_t::GetColor((userinfo_t *)((long)consoleplayer * 0x2a0 + 0x1ae70f8));
  UpdateColorsets(this);
  FName::FName(&local_48,NAME_Red);
  local_28 = (PSymbolTable *)DListMenu::GetItem(&this->super_DListMenu,&local_48);
  if (local_28 != (PSymbolTable *)0x0) {
    (*(code *)local_28->ParentSymbolTable[3].ParentSymbolTable)
              (local_28,(ulong)(local_40 == 0xffffffff));
    (*(code *)local_28->ParentSymbolTable[2].Symbols.LastFree)
              (local_28,0,(int)local_44 >> 0x10 & 0xff);
  }
  FName::FName(&local_4c,NAME_Green);
  local_28 = (PSymbolTable *)DListMenu::GetItem(&this->super_DListMenu,&local_4c);
  if (local_28 != (PSymbolTable *)0x0) {
    (*(code *)local_28->ParentSymbolTable[3].ParentSymbolTable)
              (local_28,(ulong)(local_40 == 0xffffffff));
    (*(code *)local_28->ParentSymbolTable[2].Symbols.LastFree)(local_28,0,(int)local_44 >> 8 & 0xff)
    ;
  }
  FName::FName(&local_50,NAME_Blue);
  local_28 = (PSymbolTable *)DListMenu::GetItem(&this->super_DListMenu,&local_50);
  if (local_28 != (PSymbolTable *)0x0) {
    (*(code *)local_28->ParentSymbolTable[3].ParentSymbolTable)
              (local_28,(ulong)(local_40 == 0xffffffff));
    (*(code *)local_28->ParentSymbolTable[2].Symbols.LastFree)(local_28,0,local_44 & 0xff);
  }
  FName::FName((FName *)(local_60 + 0xc),NAME_Class);
  local_28 = (PSymbolTable *)DListMenu::GetItem(&this->super_DListMenu,(FName *)(local_60 + 0xc));
  if (local_28 != (PSymbolTable *)0x0) {
    uVar2 = TArray<FPlayerClass,_FPlayerClass>::Size(&PlayerClasses);
    pPVar5 = local_28;
    if (uVar2 == 1) {
      TArray<FPlayerClass,_FPlayerClass>::operator[](&PlayerClasses,0);
      GetPrintableDisplayName((PClassPlayerPawn *)local_60);
      pcVar6 = FString::operator_cast_to_char_((FString *)local_60);
      (*(code *)pPVar5->ParentSymbolTable[2].ParentSymbolTable)(pPVar5,0,pcVar6);
      FString::~FString((FString *)local_60);
      (*(code *)local_28->ParentSymbolTable[2].Symbols.LastFree)(local_28,0);
    }
    else {
      if ((gameinfo.norandomplayerclass & 1U) == 0) {
        (*(code *)local_28->ParentSymbolTable[2].ParentSymbolTable)(local_28,0,"Random");
      }
      for (cls._0_4_ = 0; uVar2 = (uint)cls,
          uVar3 = TArray<FPlayerClass,_FPlayerClass>::Size(&PlayerClasses), uVar2 < uVar3;
          cls._0_4_ = (uint)cls + 1) {
        TArray<FPlayerClass,_FPlayerClass>::operator[](&PlayerClasses,(ulong)(uint)cls);
        GetPrintableDisplayName((PClassPlayerPawn *)local_80);
        pPVar7 = (PClass *)FString::operator_cast_to_char_((FString *)local_80);
        FString::~FString((FString *)local_80);
        if ((gameinfo.norandomplayerclass & 1U) == 0) {
          local_11c = (uint)cls + 1;
        }
        else {
          local_11c = (uint)cls;
        }
        local_78 = pPVar7;
        (*(code *)local_28->ParentSymbolTable[2].ParentSymbolTable)
                  (local_28,(ulong)local_11c,pPVar7);
      }
      local_84 = userinfo_t::GetPlayerClassNum
                           ((userinfo_t *)((long)consoleplayer * 0x2a0 + 0x1ae70f8));
      if (((gameinfo.norandomplayerclass & 1U) == 0) || (local_12c = local_84, local_84 < 0)) {
        local_12c = local_84 + 1;
      }
      (*(code *)local_28->ParentSymbolTable[2].Symbols.LastFree)(local_28,0,local_12c);
    }
  }
  UpdateSkins(this);
  FName::FName(&local_88,NAME_Gender);
  pPVar5 = (PSymbolTable *)DListMenu::GetItem(&this->super_DListMenu,&local_88);
  local_28 = pPVar5;
  if (pPVar5 != (PSymbolTable *)0x0) {
    iVar1 = userinfo_t::GetGender((userinfo_t *)((long)consoleplayer * 0x2a0 + 0x1ae70f8));
    (*(code *)pPVar5->ParentSymbolTable[2].Symbols.LastFree)(pPVar5,0,iVar1);
  }
  FName::FName(&local_8c,NAME_Autoaim);
  pPVar5 = (PSymbolTable *)DListMenu::GetItem(&this->super_DListMenu,&local_8c);
  local_28 = pPVar5;
  if (pPVar5 != (PSymbolTable *)0x0) {
    fVar9 = FFloatCVar::operator_cast_to_float(&autoaim);
    (*(code *)pPVar5->ParentSymbolTable[2].Symbols.LastFree)(pPVar5,0,(int)fVar9);
  }
  FName::FName(&local_90,NAME_Switch);
  pPVar5 = (PSymbolTable *)DListMenu::GetItem(&this->super_DListMenu,&local_90);
  local_28 = pPVar5;
  if (pPVar5 != (PSymbolTable *)0x0) {
    bVar8 = FBoolCVar::operator_cast_to_bool(&neverswitchonpickup);
    (*(code *)pPVar5->ParentSymbolTable[2].Symbols.LastFree)(pPVar5,0,bVar8);
  }
  FName::FName(&local_94,NAME_AlwaysRun);
  pPVar5 = (PSymbolTable *)DListMenu::GetItem(&this->super_DListMenu,&local_94);
  if (pPVar5 != (PSymbolTable *)0x0) {
    local_28 = pPVar5;
    bVar8 = FBoolCVar::operator_cast_to_bool(&cl_run);
    (*(code *)pPVar5->ParentSymbolTable[2].Symbols.LastFree)(pPVar5,0,bVar8);
  }
  if (((this->super_DListMenu).mDesc)->mSelectedItem < 0) {
    ((this->super_DListMenu).mDesc)->mSelectedItem = 1;
  }
  return;
}

Assistant:

void DPlayerMenu::Init(DMenu *parent, FListMenuDescriptor *desc)
{
	FListMenuItem *li;

	Super::Init(parent, desc);
	PickPlayerClass();
	mRotation = 0;

	li = GetItem(NAME_Playerdisplay);
	if (li != NULL)
	{
		li->SetValue(FListMenuItemPlayerDisplay::PDF_ROTATION, 0);
		li->SetValue(FListMenuItemPlayerDisplay::PDF_MODE, 1);
		li->SetValue(FListMenuItemPlayerDisplay::PDF_TRANSLATE, 1);
		li->SetValue(FListMenuItemPlayerDisplay::PDF_CLASS, players[consoleplayer].userinfo.GetPlayerClassNum());
		if (PlayerClass != NULL && !(GetDefaultByType (PlayerClass->Type)->flags4 & MF4_NOSKIN) &&
			players[consoleplayer].userinfo.GetPlayerClassNum() != -1)
		{
			li->SetValue(FListMenuItemPlayerDisplay::PDF_SKIN, players[consoleplayer].userinfo.GetSkin());
		}
	}

	li = GetItem(NAME_Playerbox);
	if (li != NULL)
	{
		li->SetString(0, name);
	}

	li = GetItem(NAME_Team);
	if (li != NULL)
	{
		li->SetString(0, "None");
		for(unsigned i=0;i<Teams.Size(); i++)
		{
			li->SetString(i+1, Teams[i].GetName());
		}
		li->SetValue(0, team == TEAM_NONE? 0 : team + 1);
	}

	int mycolorset = players[consoleplayer].userinfo.GetColorSet();
	int color = players[consoleplayer].userinfo.GetColor();

	UpdateColorsets();

	li = GetItem(NAME_Red);
	if (li != NULL)
	{
		li->Enable(mycolorset == -1);
		li->SetValue(0, RPART(color));
	}

	li = GetItem(NAME_Green);
	if (li != NULL)
	{
		li->Enable(mycolorset == -1);
		li->SetValue(0, GPART(color));
	}

	li = GetItem(NAME_Blue);
	if (li != NULL)
	{
		li->Enable(mycolorset == -1);
		li->SetValue(0, BPART(color));
	}

	li = GetItem(NAME_Class);
	if (li != NULL)
	{
		if (PlayerClasses.Size() == 1)
		{
			li->SetString(0, GetPrintableDisplayName(PlayerClasses[0].Type));
			li->SetValue(0, 0);
		}
		else
		{
			// [XA] Remove the "Random" option if the relevant gameinfo flag is set.
			if(!gameinfo.norandomplayerclass)
				li->SetString(0, "Random");
			for(unsigned i=0; i< PlayerClasses.Size(); i++)
			{
				const char *cls = GetPrintableDisplayName(PlayerClasses[i].Type);
				li->SetString(gameinfo.norandomplayerclass ? i : i+1, cls);
			}
			int pclass = players[consoleplayer].userinfo.GetPlayerClassNum();
			li->SetValue(0, gameinfo.norandomplayerclass && pclass >= 0 ? pclass : pclass + 1);
		}
	}

	UpdateSkins();

	li = GetItem(NAME_Gender);
	if (li != NULL)
	{
		li->SetValue(0, players[consoleplayer].userinfo.GetGender());
	}

	li = GetItem(NAME_Autoaim);
	if (li != NULL)
	{
		li->SetValue(0, (int)autoaim);
	}

	li = GetItem(NAME_Switch);
	if (li != NULL)
	{
		li->SetValue(0, neverswitchonpickup);
	}

	li = GetItem(NAME_AlwaysRun);
	if (li != NULL)
	{
		li->SetValue(0, cl_run);
	}

	if (mDesc->mSelectedItem < 0) mDesc->mSelectedItem = 1;

}